

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall
ON_Plane::GetDistanceToBoundingBox(ON_Plane *this,ON_BoundingBox *Box,double *min,double *max)

{
  double dVar1;
  bool bVar2;
  ON_3dVector *pOVar3;
  ON_3dPoint *pOVar4;
  double *pdVar5;
  double local_190;
  double local_180;
  double local_170;
  ON_3dVector local_160;
  double local_148;
  double d;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  undefined1 local_b0 [8];
  ON_3dPoint P;
  int local_90;
  int i2;
  int i1;
  int i0;
  ON_3dVector local_70;
  double local_58;
  double maxd;
  double mind;
  ON_3dVector UnitNormal;
  double *max_local;
  double *min_local;
  ON_BoundingBox *Box_local;
  ON_Plane *this_local;
  
  UnitNormal.z = (double)max;
  pOVar3 = Normal(this);
  mind = pOVar3->x;
  UnitNormal.x = pOVar3->y;
  UnitNormal.y = pOVar3->z;
  bVar2 = ON_3dVector::Unitize((ON_3dVector *)&mind);
  if (bVar2) {
    ON_BoundingBox::Min((ON_3dPoint *)&i1,Box);
    pOVar4 = Origin(this);
    ON_3dPoint::operator-(&local_70,(ON_3dPoint *)&i1,pOVar4);
    local_58 = ON_3dVector::operator*(&local_70,(ON_3dVector *)&mind);
    maxd = local_58;
    for (i2 = 0; i2 < 2; i2 = i2 + 1) {
      for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
        for (P.z._4_4_ = 0; P.z._4_4_ < 2; P.z._4_4_ = P.z._4_4_ + 1) {
          if (((i2 != 0) || (local_90 != 0)) || (dVar1 = maxd, P.z._4_4_ != 0)) {
            if (i2 == 0) {
              ON_BoundingBox::Min(&local_e0,Box);
              pdVar5 = ON_3dPoint::operator[](&local_e0,0);
              local_170 = *pdVar5;
            }
            else {
              ON_BoundingBox::Max(&local_c8,Box);
              pdVar5 = ON_3dPoint::operator[](&local_c8,0);
              local_170 = *pdVar5;
            }
            pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)local_b0,0);
            *pdVar5 = local_170;
            if (local_90 == 0) {
              ON_BoundingBox::Min(&local_110,Box);
              pdVar5 = ON_3dPoint::operator[](&local_110,1);
              local_180 = *pdVar5;
            }
            else {
              ON_BoundingBox::Max(&local_f8,Box);
              pdVar5 = ON_3dPoint::operator[](&local_f8,1);
              local_180 = *pdVar5;
            }
            pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)local_b0,1);
            *pdVar5 = local_180;
            if (P.z._4_4_ == 0) {
              ON_BoundingBox::Min((ON_3dPoint *)&d,Box);
              pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&d,2);
              local_190 = *pdVar5;
            }
            else {
              ON_BoundingBox::Max(&local_128,Box);
              pdVar5 = ON_3dPoint::operator[](&local_128,2);
              local_190 = *pdVar5;
            }
            pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)local_b0,2);
            *pdVar5 = local_190;
            pOVar4 = Origin(this);
            ON_3dPoint::operator-(&local_160,(ON_3dPoint *)local_b0,pOVar4);
            local_148 = ON_3dVector::operator*(&local_160,(ON_3dVector *)&mind);
            dVar1 = local_148;
            if ((maxd <= local_148) && (dVar1 = maxd, local_58 < local_148)) {
              local_58 = local_148;
            }
          }
          maxd = dVar1;
        }
      }
    }
    *min = maxd;
    *(double *)UnitNormal.z = local_58;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Plane::GetDistanceToBoundingBox(const ON_BoundingBox& Box,
				                                double* min, double* max) const
{
  //min and max signed distance.  Returns false if plane normal has zero length.

  ON_3dVector UnitNormal = Normal();
  if (!UnitNormal.Unitize()) 
    return false;

  double mind, maxd;
  mind = maxd = (Box.Min() - Origin())*UnitNormal;
  int i0, i1, i2;
  for (i0=0;i0<2;i0++)
  {
    for(i1=0;i1<2;i1++) 
    {
      for (i2=0;i2<2;i2++) 
      {
        if (i0||i1||i2) 
        {
          ON_3dPoint P;
          P[0]=(i0)?Box.Max()[0]:Box.Min()[0];
          P[1]=(i1)?Box.Max()[1]:Box.Min()[1];
          P[2]=(i2)?Box.Max()[2]:Box.Min()[2];
          double d = (P - Origin())*UnitNormal;
          //double dd = P.DistanceTo(ClosestPointTo(P));
          if (d < mind) 
            mind=d;
          else if (d > maxd) 
            maxd=d;
        }
      }
    }
  }
  *min = mind;
  *max = maxd;
  return true;
}